

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O0

uint __thiscall
InliningDecider::InlinePolymorphicCallSite
          (InliningDecider *this,FunctionBody *inliner,ProfileId profiledCallSiteId,
          FunctionBody **functionBodyArray,uint functionBodyArrayLength,bool *canInlineArray,
          uint recursiveInlineDepth)

{
  code *pcVar1;
  ushort uVar2;
  FunctionBody *inliner_00;
  bool bVar3;
  ProfileId PVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  int iVar7;
  int iVar8;
  undefined4 *puVar9;
  FunctionInfo *pFVar10;
  undefined4 extraout_var;
  char16 *pcVar11;
  undefined4 extraout_var_00;
  char16 *pcVar12;
  wchar local_108 [4];
  char16 debugStringBuffer2 [42];
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  uint actualInlineeCount;
  uint inlineeCount;
  bool isConstructorCall;
  DynamicProfileInfo *profileData;
  bool *canInlineArray_local;
  FunctionBody **ppFStack_30;
  uint functionBodyArrayLength_local;
  FunctionBody **functionBodyArray_local;
  FunctionBody *pFStack_20;
  ProfileId profiledCallSiteId_local;
  FunctionBody *inliner_local;
  InliningDecider *this_local;
  
  profileData = (DynamicProfileInfo *)canInlineArray;
  canInlineArray_local._4_4_ = functionBodyArrayLength;
  ppFStack_30 = functionBodyArray;
  functionBodyArray_local._6_2_ = profiledCallSiteId;
  pFStack_20 = inliner;
  inliner_local = (FunctionBody *)this;
  if (inliner == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xaf,"(inliner)","inliner");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar2 = functionBodyArray_local._6_2_;
  PVar4 = Js::FunctionBody::GetProfiledCallSiteCount(pFStack_20);
  if (PVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xb0,"(profiledCallSiteId < inliner->GetProfiledCallSiteCount())",
                       "profiledCallSiteId < inliner->GetProfiledCallSiteCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (ppFStack_30 == (FunctionBody **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xb1,"(functionBodyArray)","functionBodyArray");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  _inlineeCount = Js::FunctionBody::GetAnyDynamicProfileInfo(pFStack_20);
  if (_inlineeCount == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xb4,"(profileData)","profileData");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = Js::DynamicProfileInfo::GetPolymorphicCallSiteInfo
                    (_inlineeCount,pFStack_20,functionBodyArray_local._6_2_,
                     (bool *)((long)&actualInlineeCount + 3),ppFStack_30,canInlineArray_local._4_4_)
  ;
  if (bVar3) {
    debugStringBuffer[0x26] = L'\0';
    debugStringBuffer[0x27] = L'\0';
    debugStringBuffer[0x28] = L'\0';
    debugStringBuffer[0x29] = L'\0';
    for (; inliner_00 = pFStack_20, (uint)debugStringBuffer._80_4_ < canInlineArray_local._4_4_;
        debugStringBuffer._80_4_ = debugStringBuffer._80_4_ + 1) {
      if (ppFStack_30[(uint)debugStringBuffer._80_4_] == (FunctionBody *)0x0) {
        if ((uint)debugStringBuffer._80_4_ < 2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                             ,0xc3,"(inlineeCount >= 2)",
                             "There are at least two polymorphic call site");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        break;
      }
      pFVar10 = Js::FunctionProxy::GetFunctionInfo
                          ((FunctionProxy *)ppFStack_30[(uint)debugStringBuffer._80_4_]);
      pFVar10 = Inline(this,inliner_00,pFVar10,(bool)(actualInlineeCount._3_1_ & 1),true,false,0,
                       functionBodyArray_local._6_2_,recursiveInlineDepth,false);
      if (pFVar10 != (FunctionInfo *)0x0) {
        *(undefined1 *)
         ((long)&(profileData->dynamicProfileFunctionInfo).ptr +
         (ulong)(uint)debugStringBuffer._80_4_) = 1;
        debugStringBuffer._76_4_ = debugStringBuffer._76_4_ + 1;
      }
    }
    if (debugStringBuffer._80_4_ != debugStringBuffer._76_4_) {
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFStack_20);
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFStack_20);
      bVar3 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01eafdf0,PartialPolymorphicInlinePhase,uVar5,LVar6);
      if ((bVar3) || ((this->isLoopBody & 1U) != 0)) {
        return 0;
      }
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar5,LVar6);
      if (bVar3) {
        iVar7 = (*(ppFStack_30[debugStringBuffer._80_4_ - 1]->super_ParseableFunctionInfo).
                  super_FunctionProxy.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[7])();
        pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)ppFStack_30[debugStringBuffer._80_4_ - 1],
                             (wchar (*) [42])local_a8);
        iVar8 = (*(pFStack_20->super_ParseableFunctionInfo).super_FunctionProxy.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [7])();
        pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)pFStack_20,(wchar (*) [42])local_108);
        Output::Print(L"Partial inlining of polymorphic call: %s (%s)\tCaller: %s (%s)\n",
                      CONCAT44(extraout_var,iVar7),pcVar11,CONCAT44(extraout_var_00,iVar8),pcVar12);
        Output::Flush();
      }
    }
    this_local._4_2_ = debugStringBuffer[0x28];
    this_local._6_2_ = debugStringBuffer[0x29];
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint InliningDecider::InlinePolymorphicCallSite(Js::FunctionBody *const inliner, const Js::ProfileId profiledCallSiteId,
    Js::FunctionBody** functionBodyArray, uint functionBodyArrayLength, bool* canInlineArray, uint recursiveInlineDepth)
{
    Assert(inliner);
    Assert(profiledCallSiteId < inliner->GetProfiledCallSiteCount());
    Assert(functionBodyArray);

    const auto profileData = inliner->GetAnyDynamicProfileInfo();
    Assert(profileData);

    bool isConstructorCall;
    if (!profileData->GetPolymorphicCallSiteInfo(inliner, profiledCallSiteId, &isConstructorCall, functionBodyArray, functionBodyArrayLength))
    {
        return 0;
    }

    uint inlineeCount = 0;
    uint actualInlineeCount  = 0;

    for (inlineeCount = 0; inlineeCount < functionBodyArrayLength; inlineeCount++)
    {
        if (!functionBodyArray[inlineeCount])
        {
            AssertMsg(inlineeCount >= 2, "There are at least two polymorphic call site");
            break;
        }
        if (Inline(inliner, functionBodyArray[inlineeCount]->GetFunctionInfo(), isConstructorCall, true /*isPolymorphicCall*/, false /*isCallback*/, 0, profiledCallSiteId, recursiveInlineDepth, false))
        {
            canInlineArray[inlineeCount] = true;
            actualInlineeCount++;
        }
    }
    if (inlineeCount != actualInlineeCount)
    {
        // We generate polymorphic dispatch and call even if there are no inlinees as it's seen to provide a perf boost
        // Skip loop bodies for now as we do not handle re-jit scenarios for the bailouts from them
        if (!PHASE_OFF(Js::PartialPolymorphicInlinePhase, inliner) && !this->isLoopBody)
        {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            INLINE_TESTTRACE(_u("Partial inlining of polymorphic call: %s (%s)\tCaller: %s (%s)\n"),
                functionBodyArray[inlineeCount - 1]->GetDisplayName(), functionBodyArray[inlineeCount - 1]->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
        }
        else
        {
            return 0;
        }
    }
    return inlineeCount;
}